

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Fire_PDU::SetDescriptor(Fire_PDU *this,DescPtr *D)

{
  undefined1 *puVar1;
  Descriptor *pDVar2;
  long lVar3;
  
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=(&this->m_pDescriptor,D);
  pDVar2 = (this->m_pDescriptor).m_pRef;
  if ((pDVar2 != (Descriptor *)0x0) &&
     (lVar3 = __dynamic_cast(pDVar2,&DATA_TYPE::Descriptor::typeinfo,
                             &DATA_TYPE::MunitionDescriptor::typeinfo,0), lVar3 != 0)) {
    puVar1 = &(this->super_Warfare_Header).super_Header.super_Header6.field_0x25;
    *puVar1 = *puVar1 & 0xfe;
    return;
  }
  puVar1 = &(this->super_Warfare_Header).super_Header.super_Header6.field_0x25;
  *puVar1 = *puVar1 | 1;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolVersion = '\a';
  return;
}

Assistant:

void Fire_PDU::SetDescriptor( DescPtr D )
{
    m_pDescriptor = D;

    #if DIS_VERSION > 6

    // Determine the FTI
    if( dynamic_cast<MunitionDescriptor*>( m_pDescriptor.GetPtr() ) )
    {
        m_PDUStatusUnion.m_ui8PDUStatusFTI = MunitionFTI;
    }
    else
    {
        m_PDUStatusUnion.m_ui8PDUStatusFTI = ExpendableFTI;
        m_ui8ProtocolVersion = IEEE_1278_1_2012; // We are using a DIS 7 feature now.
    }

    #endif
}